

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

uint32 __thiscall
Wasm::WasmBytecodeGenerator::WriteTypeStackToString
          (WasmBytecodeGenerator *this,char16 *out,uint32 maxlen)

{
  WasmType type;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  EmitInfo *pEVar6;
  char16 *pcVar7;
  int iVar8;
  ulong _SizeInWords;
  int iVar9;
  uint32 uVar10;
  
  _SizeInWords = (ulong)maxlen;
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x37,"(out != nullptr)","out != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = _snwprintf_unsafe(out,_SizeInWords,0xffffffffffffffff,L"[");
  iVar8 = -1;
  iVar9 = -1;
  do {
    iVar4 = iVar9;
    pEVar6 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                       ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)
                        &this->m_evalStack,
                        (this->m_evalStack).list.
                        super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                        count + iVar8);
    iVar9 = iVar4 + 1;
    iVar8 = iVar8 + -1;
  } while (pEVar6->type != Limit);
  if (-1 < iVar4) {
    iVar8 = -iVar9;
    bVar2 = true;
    do {
      pEVar6 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                         ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)
                          &this->m_evalStack,
                          (this->m_evalStack).list.
                          super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          .count + iVar8);
      type = pEVar6->type;
      if (!bVar2) {
        iVar4 = _snwprintf_unsafe(out + uVar3,(ulong)(maxlen - uVar3),0xffffffffffffffff,L", ");
        uVar3 = uVar3 + iVar4;
      }
      pcVar7 = WasmTypes::GetTypeName(type);
      bVar2 = false;
      iVar4 = _snwprintf_unsafe(out + uVar3,(ulong)(maxlen - uVar3),0xffffffffffffffff,pcVar7);
      uVar3 = uVar3 + iVar4;
      iVar8 = iVar8 + 1;
      iVar9 = iVar9 + -1;
    } while (0 < iVar9);
  }
  iVar9 = _snwprintf_unsafe(out + uVar3,(ulong)(maxlen - uVar3),0xffffffffffffffff,L"]");
  uVar10 = iVar9 + uVar3;
  if (maxlen - 5 <= uVar10) {
    out[_SizeInWords - 1] = L'\0';
    pcVar7 = out + (_SizeInWords - 5);
    pcVar7[0] = L'\0';
    pcVar7[1] = L'\0';
    pcVar7[2] = L'\0';
    pcVar7[3] = L'\0';
    iVar9 = _snwprintf_unsafe(out + (uVar10 - 5),(ulong)(maxlen - (uVar10 - 5)),0xffffffffffffffff,
                              L"...]");
    uVar10 = (uVar10 + iVar9) - 5;
  }
  return uVar10;
}

Assistant:

uint32 WasmBytecodeGenerator::WriteTypeStackToString(_Out_writes_(maxlen) char16* out, uint32 maxlen) const
{
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
    WriteTypeStack([&] (const char16* msg)
    {
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, msg);
    });
    if (numwritten >= maxlen - 5)
    {
        // null out the last 5 characters so we can properly end it
        for (int i = 1; i <= 5; i++)
        {
            *(out + maxlen - i) = 0;
        }
        numwritten -= 5;
        numwritten += _snwprintf_s(out + numwritten, maxlen - numwritten, _TRUNCATE, _u("...]"));
    }
    return numwritten;
}